

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O0

void __thiscall adios2::transport::FileFStream::FileFStream(FileFStream *this,Comm *comm)

{
  undefined8 *in_RDI;
  allocator local_69;
  Comm *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  Transport *in_stack_ffffffffffffffb0;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"File",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98,"fstream",&local_69);
  Transport::Transport
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *in_RDI = &PTR__FileFStream_01135530;
  std::fstream::fstream(in_RDI + 0x1e);
  *(undefined1 *)(in_RDI + 0x60) = 0;
  std::future<void>::future((future<void> *)0xd59af9);
  return;
}

Assistant:

FileFStream::FileFStream(helper::Comm const &comm) : Transport("File", "fstream", comm) {}